

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg.cpp
# Opt level: O1

Color __thiscall
CGL::TexTri::color(TexTri *this,Vector3D *p_bary,Vector3D *p_dx_bary,Vector3D *p_dy_bary,
                  SampleParams *sp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Color CVar7;
  
  dVar1 = p_bary->x;
  dVar2 = p_bary->y;
  dVar3 = (this->p0_uv).y;
  dVar4 = (this->p1_uv).y;
  dVar5 = p_bary->z;
  dVar6 = (this->p2_uv).y;
  (sp->p_uv).x = (this->p2_uv).x * dVar5 + (this->p1_uv).x * dVar2 + (this->p0_uv).x * dVar1;
  (sp->p_uv).y = dVar5 * dVar6 + dVar2 * dVar4 + dVar1 * dVar3;
  dVar1 = p_dx_bary->x;
  dVar2 = (this->p0_uv).y;
  dVar3 = p_dx_bary->y;
  dVar4 = (this->p1_uv).y;
  dVar5 = p_dx_bary->z;
  dVar6 = (this->p2_uv).y;
  (sp->p_dx_uv).x = (this->p2_uv).x * dVar5 + (this->p1_uv).x * dVar3 + (this->p0_uv).x * dVar1;
  (sp->p_dx_uv).y = dVar5 * dVar6 + dVar3 * dVar4 + dVar1 * dVar2;
  dVar1 = p_dy_bary->x;
  dVar2 = p_dy_bary->y;
  dVar3 = (this->p0_uv).y;
  dVar4 = (this->p1_uv).y;
  dVar5 = p_dy_bary->z;
  dVar6 = (this->p2_uv).y;
  (sp->p_dy_uv).x = (this->p2_uv).x * dVar5 + (this->p1_uv).x * dVar2 + (this->p0_uv).x * dVar1;
  (sp->p_dy_uv).y = dVar5 * dVar6 + dVar2 * dVar4 + dVar1 * dVar3;
  CVar7 = Texture::sample(this->tex,sp);
  return CVar7;
}

Assistant:

Color TexTri::color(Vector3D p_bary, Vector3D p_dx_bary, Vector3D p_dy_bary, SampleParams sp) {
  // Part 5: Fill this in with bilinear sampling.
    Vector2D uv = this->p0_uv * p_bary.x + this->p1_uv * p_bary.y + this->p2_uv * p_bary.z;
    sp.p_uv = uv;
    Vector2D dx_uv = this->p0_uv * p_dx_bary.x + this->p1_uv * p_dx_bary.y + this->p2_uv * p_dx_bary.z;
    sp.p_dx_uv = dx_uv;
    Vector2D dy_uv = this->p0_uv * p_dy_bary.x + this->p1_uv * p_dy_bary.y + this->p2_uv * p_dy_bary.z;
    sp.p_dy_uv = dy_uv;
    
    return this->tex->sample(sp);
  // Part 6: Fill this in with trilinear sampling as well.
}